

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

SymID __thiscall IRBuilder::BuildSrcStackSymID(IRBuilder *this,RegSlot regSlot)

{
  BVFixed *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  SymID SVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *this_01;
  
  if (regSlot < this->firstTemp) {
    bVar2 = IsLoopBody(this);
    if (!bVar2) {
      return regSlot;
    }
    BVar4 = RegIsConstant(this,regSlot);
    if (BVar4 != 0) {
      return regSlot;
    }
  }
  else {
    SVar5 = GetMappedTemp(this,regSlot);
    if (SVar5 != 0) {
      return SVar5;
    }
    bVar2 = IsLoopBody(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x4c8,"(this->IsLoopBody())","this->IsLoopBody()");
      if (!bVar2) goto LAB_00490399;
      *puVar7 = 0;
    }
    this_00 = this->m_usedAsTemp;
    this_01 = Func::GetJITFunctionBody(this->m_func);
    RVar6 = JITTimeFunctionBody::GetFirstTmpReg(this_01);
    BVar3 = BVFixed::Test(this_00,regSlot - RVar6);
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x4c9,
                         "(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()))"
                         ,
                         "!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg())"
                        );
      if (!bVar2) {
LAB_00490399:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    SetMappedTemp(this,regSlot,regSlot);
  }
  EnsureLoopBodyLoadSlot(this,regSlot,false);
  return regSlot;
}

Assistant:

SymID
IRBuilder::BuildSrcStackSymID(Js::RegSlot regSlot)
{
    SymID symID;

    if (this->RegIsTemp(regSlot))
    {
        // This is a use of a temp. Map the reg slot to its sym ID.
        //     !!!NOTE: always process an instruction's temp uses before its temp defs!!!
        symID = this->GetMappedTemp(regSlot);
        if (symID == 0)
        {
            // We might have temps that are live through the loop body via "with" statement
            // We need to treat those as if they are locals and don't remap them
            Assert(this->IsLoopBody());
            Assert(!this->m_usedAsTemp->Test(regSlot - m_func->GetJITFunctionBody()->GetFirstTmpReg()));

            symID = static_cast<SymID>(regSlot);
            this->SetMappedTemp(regSlot, symID);
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    else
    {
        symID = static_cast<SymID>(regSlot);
        if (IsLoopBody() && !this->RegIsConstant(regSlot))
        {
            this->EnsureLoopBodyLoadSlot(symID);
        }
    }
    return symID;
}